

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::SonarQubeReporter::writeTestCase(SonarQubeReporter *this,TestCaseNode *testCaseNode)

{
  SectionNode *sectionNode;
  bool okToFail;
  size_type sVar1;
  const_reference this_00;
  allocator<char> local_41;
  string local_40;
  SectionNode *local_20;
  SectionNode *rootSection;
  TestCaseNode *testCaseNode_local;
  SonarQubeReporter *this_local;
  
  rootSection = (SectionNode *)testCaseNode;
  testCaseNode_local = (TestCaseNode *)this;
  sVar1 = std::
          vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
          ::size(&testCaseNode->children);
  if (sVar1 == 1) {
    this_00 = std::
              vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
              ::front((vector<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>,_std::allocator<Catch::Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>_>_>
                       *)&rootSection->stdOut);
    local_20 = Detail::unique_ptr<Catch::CumulativeReporterBase::SectionNode>::operator*(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
    sectionNode = local_20;
    okToFail = TestCaseInfo::okToFail(*(TestCaseInfo **)&(rootSection->stats).sectionInfo.name);
    writeSection(this,&local_40,sectionNode,okToFail);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    return;
  }
  __assert_fail("testCaseNode.children.size() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/test/catch_amalgamated.cpp"
                ,0x26fa,"void Catch::SonarQubeReporter::writeTestCase(const TestCaseNode &)");
}

Assistant:

void SonarQubeReporter::writeTestCase(TestCaseNode const& testCaseNode) {
        // All test cases have exactly one section - which represents the
        // test case itself. That section may have 0-n nested sections
        assert(testCaseNode.children.size() == 1);
        SectionNode const& rootSection = *testCaseNode.children.front();
        writeSection("", rootSection, testCaseNode.value.testInfo->okToFail());
    }